

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O2

void print_boolean_expr(BoolExpr *be)

{
  BoolExpr *pBVar1;
  BoolExprStruct **ppBVar2;
  char *__format;
  
  switch(be->type) {
  case E_FALSE:
    __format = "false ";
    break;
  case E_TRUE:
    __format = "true ";
    break;
  case E_UNKNOWN:
    __format = "? ";
    break;
  case E_AND:
    printf("(and ");
    __format = ") ";
    ppBVar2 = &be->subexpr;
    while (pBVar1 = *ppBVar2, pBVar1 != (BoolExpr *)0x0) {
      print_boolean_expr(pBVar1);
      ppBVar2 = &pBVar1->next;
    }
    break;
  case E_OR:
    printf("(or ");
    __format = ") ";
    ppBVar2 = &be->subexpr;
    while (pBVar1 = *ppBVar2, pBVar1 != (BoolExpr *)0x0) {
      print_boolean_expr(pBVar1);
      ppBVar2 = &pBVar1->next;
    }
    break;
  case E_XOR:
    printf("(xor ");
    __format = ") ";
    ppBVar2 = &be->subexpr;
    while (pBVar1 = *ppBVar2, pBVar1 != (BoolExpr *)0x0) {
      print_boolean_expr(pBVar1);
      ppBVar2 = &pBVar1->next;
    }
    break;
  case E_NOT:
    printf("(not ");
    print_boolean_expr(be->subexpr);
    __format = ") ";
    break;
  default:
    return;
  }
  printf(__format);
  return;
}

Assistant:

void
print_boolean_expr (const BoolExpr *be)
{
  switch (be->type) {
  case E_TRUE:    printf ("true ");   break;
  case E_FALSE:   printf ("false ");   break;
  case E_UNKNOWN: printf ("? ");    break;
  case E_NOT:
    printf ("(not ");
    print_boolean_expr (be->subexpr);
    printf (") ");
    break;
  case E_AND:
    printf ("(and ");
    for (be=be->subexpr; be != NULL; be=be->next)
      print_boolean_expr (be);
    printf (") ");
    break;
  case E_OR:
    printf ("(or ");
    for (be=be->subexpr; be != NULL; be=be->next)
      print_boolean_expr (be);
    printf (") ");
    break;
  case E_XOR:
    printf ("(xor ");
    for (be=be->subexpr; be != NULL; be=be->next)
      print_boolean_expr (be);
    printf (") ");
    break;
  }
}